

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_choice_dflt(lysc_ctx *ctx,lysp_qname *dflt,lysc_node_choice *ch)

{
  char *pcVar1;
  lysc_node_case *plVar2;
  lys_module *local_70;
  ulong local_50;
  size_t prefix_len;
  char *name;
  char *prefix;
  lys_module *mod;
  lysc_node *iter;
  lysc_node_choice *ch_local;
  lysp_qname *dflt_local;
  lysc_ctx *ctx_local;
  
  name = (char *)0x0;
  local_50 = 0;
  pcVar1 = strchr(dflt->str,0x3a);
  if (pcVar1 == (char *)0x0) {
    prefix_len = (size_t)dflt->str;
  }
  else {
    name = dflt->str;
    local_50 = (long)pcVar1 - (long)name;
    prefix_len = (size_t)(pcVar1 + 1);
  }
  if (name == (char *)0x0) {
    prefix = (char *)(ch->field_0).node.module;
  }
  else {
    prefix = (char *)ly_resolve_prefix(ctx->ctx,name,local_50,LY_VALUE_SCHEMA,dflt->mod);
    if ((lys_module *)prefix == (lys_module *)0x0) {
      if (((byte)dflt->mod->field_0x79 >> 1 & 1) == 0) {
        local_70 = (lys_module *)dflt->mod->mod->name;
      }
      else {
        local_70 = dflt->mod[1].mod;
      }
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,
              "Default case prefix \"%.*s\" not found in imports of \"%s\".",local_50 & 0xffffffff,
              name,local_70);
      return LY_EVALID;
    }
  }
  plVar2 = (lysc_node_case *)
           lys_find_child((lysc_node *)ch,(lys_module *)prefix,(char *)prefix_len,0,0x80,4);
  ch->dflt = plVar2;
  if (ch->dflt == (lysc_node_case *)0x0) {
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Default case \"%s\" not found.",dflt->str);
    ctx_local._4_4_ = LY_EVALID;
  }
  else {
    for (mod = (lys_module *)ch->dflt->child;
        (mod != (lys_module *)0x0 && ((lysc_node_case *)mod->revision == ch->dflt));
        mod = (lys_module *)mod->ns) {
      if (((ulong)mod->ctx & 0x200000) != 0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                "Mandatory node \"%s\" under the default case \"%s\".",mod->filepath,dflt->str);
        return LY_EVALID;
      }
    }
    if (((ch->field_0).node.flags & 0x20) == 0) {
      (ch->dflt->field_0).node.flags = (ch->dflt->field_0).node.flags | 0x200;
      ctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Invalid mandatory choice with a default case.");
      ctx_local._4_4_ = LY_EVALID;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_node_choice_dflt(struct lysc_ctx *ctx, struct lysp_qname *dflt, struct lysc_node_choice *ch)
{
    struct lysc_node *iter;
    const struct lys_module *mod;
    const char *prefix = NULL, *name;
    size_t prefix_len = 0;

    /* could use lys_parse_nodeid(), but it checks syntax which is already done in this case by the parsers */
    name = strchr(dflt->str, ':');
    if (name) {
        prefix = dflt->str;
        prefix_len = name - prefix;
        ++name;
    } else {
        name = dflt->str;
    }
    if (prefix) {
        mod = ly_resolve_prefix(ctx->ctx, prefix, prefix_len, LY_VALUE_SCHEMA, (void *)dflt->mod);
        if (!mod) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Default case prefix \"%.*s\" not found "
                    "in imports of \"%s\".", (int)prefix_len, prefix, LYSP_MODULE_NAME(dflt->mod));
            return LY_EVALID;
        }
    } else {
        mod = ch->module;
    }

    ch->dflt = (struct lysc_node_case *)lys_find_child(&ch->node, mod, name, 0, LYS_CASE, LYS_GETNEXT_WITHCASE);
    if (!ch->dflt) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                "Default case \"%s\" not found.", dflt->str);
        return LY_EVALID;
    }

    /* no mandatory nodes directly under the default case */
    LY_LIST_FOR(ch->dflt->child, iter) {
        if (iter->parent != (struct lysc_node *)ch->dflt) {
            break;
        }
        if (iter->flags & LYS_MAND_TRUE) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                    "Mandatory node \"%s\" under the default case \"%s\".", iter->name, dflt->str);
            return LY_EVALID;
        }
    }

    if (ch->flags & LYS_MAND_TRUE) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Invalid mandatory choice with a default case.");
        return LY_EVALID;
    }

    ch->dflt->flags |= LYS_SET_DFLT;
    return LY_SUCCESS;
}